

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

value_type
pugi::impl::anon_unknown_0::utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_writer>
          (uint *data,ulong size,value_type result)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  
LAB_001a8d3d:
  do {
    puVar6 = data;
    lVar8 = 3;
    lVar7 = 0;
    while( true ) {
      uVar1 = size + lVar7;
      if (uVar1 == 0) {
        return result;
      }
      bVar2 = *(byte *)((long)puVar6 + lVar8 + -3);
      uVar5 = (uint)bVar2;
      if (-1 < (char)bVar2) {
        *result = uVar5;
        result = result + 1;
        data = (uint *)((long)puVar6 + (1 - lVar7));
        size = (size + lVar7) - 1;
        if ((size < 4) || ((((int)puVar6 - (int)lVar7) + 1U & 3) != 0)) goto LAB_001a8d3d;
        goto LAB_001a8e62;
      }
      if (((uVar1 != 1) && ((uVar5 & 0xffffffe0) == 0xc0)) &&
         (bVar3 = *(byte *)((long)puVar6 + lVar8 + -2), (bVar3 & 0xc0) == 0x80)) {
        *result = bVar3 & 0x3f | (uVar5 & 0x1f) << 6;
        result = result + 1;
        size = (size + lVar7) - 2;
        data = (uint *)((long)puVar6 + (2 - lVar7));
        goto LAB_001a8d3d;
      }
      if (((2 < uVar1) && ((uVar5 & 0xfffffff0) == 0xe0)) &&
         ((bVar3 = *(byte *)((long)puVar6 + lVar8 + -2), (bVar3 & 0xc0) == 0x80 &&
          (uVar4 = (uint)*(byte *)((long)puVar6 + lVar8 + -1), (uVar4 & 0xffffffc0) == 0x80)))) {
        *result = uVar4 & 0x3f | (bVar3 & 0x3f) << 6 | (bVar2 & 0xf) << 0xc;
        result = result + 1;
        size = (size + lVar7) - 3;
        data = (uint *)((long)puVar6 + (3 - lVar7));
        goto LAB_001a8d3d;
      }
      if (((3 < uVar1) && ((bVar2 & 0xf8) == 0xf0)) &&
         ((uVar4 = (uint)*(byte *)((long)puVar6 + lVar8 + -2), (uVar4 & 0xffffffc0) == 0x80 &&
          ((bVar2 = *(byte *)((long)puVar6 + lVar8 + -1), (bVar2 & 0xc0) == 0x80 &&
           ((*(byte *)((long)puVar6 + lVar8) & 0xffffffc0) == 0x80)))))) break;
      lVar7 = lVar7 + -1;
      lVar8 = lVar8 + 1;
    }
    *result = *(byte *)((long)puVar6 + lVar8) & 0x3f |
              (bVar2 & 0x3f) << 6 | (uVar4 & 0x3f) << 0xc | (uVar5 & 7) << 0x12;
    result = result + 1;
    size = (size + lVar7) - 4;
    data = (uint *)((long)puVar6 + (4 - lVar7));
  } while( true );
  while( true ) {
    *result = *data & 0x7f;
    result[1] = (uint)*(byte *)((long)data + 1);
    result[2] = (uint)*(byte *)((long)data + 2);
    result[3] = (uint)*(byte *)((long)data + 3);
    result = result + 4;
    data = data + 1;
    size = size - 4;
    if (size < 4) break;
LAB_001a8e62:
    if ((*data & 0x80808080) != 0) break;
  }
  goto LAB_001a8d3d;
}

Assistant:

static inline typename Traits::value_type process(const uint8_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			const uint8_t utf8_byte_mask = 0x3f;

			while (size)
			{
				uint8_t lead = *data;

				// 0xxxxxxx -> U+0000..U+007F
				if (lead < 0x80)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;

					// process aligned single-byte (ascii) blocks
					if ((reinterpret_cast<uintptr_t>(data) & 3) == 0)
					{
						// round-trip through void* to silence 'cast increases required alignment of target type' warnings
						while (size >= 4 && (*static_cast<const uint32_t*>(static_cast<const void*>(data)) & 0x80808080) == 0)
						{
							result = Traits::low(result, data[0]);
							result = Traits::low(result, data[1]);
							result = Traits::low(result, data[2]);
							result = Traits::low(result, data[3]);
							data += 4;
							size -= 4;
						}
					}
				}
				// 110xxxxx -> U+0080..U+07FF
				else if (static_cast<unsigned int>(lead - 0xC0) < 0x20 && size >= 2 && (data[1] & 0xc0) == 0x80)
				{
					result = Traits::low(result, ((lead & ~0xC0) << 6) | (data[1] & utf8_byte_mask));
					data += 2;
					size -= 2;
				}
				// 1110xxxx -> U+0800-U+FFFF
				else if (static_cast<unsigned int>(lead - 0xE0) < 0x10 && size >= 3 && (data[1] & 0xc0) == 0x80 && (data[2] & 0xc0) == 0x80)
				{
					result = Traits::low(result, ((lead & ~0xE0) << 12) | ((data[1] & utf8_byte_mask) << 6) | (data[2] & utf8_byte_mask));
					data += 3;
					size -= 3;
				}
				// 11110xxx -> U+10000..U+10FFFF
				else if (static_cast<unsigned int>(lead - 0xF0) < 0x08 && size >= 4 && (data[1] & 0xc0) == 0x80 && (data[2] & 0xc0) == 0x80 && (data[3] & 0xc0) == 0x80)
				{
					result = Traits::high(result, ((lead & ~0xF0) << 18) | ((data[1] & utf8_byte_mask) << 12) | ((data[2] & utf8_byte_mask) << 6) | (data[3] & utf8_byte_mask));
					data += 4;
					size -= 4;
				}
				// 10xxxxxx or 11111xxx -> invalid
				else
				{
					data += 1;
					size -= 1;
				}
			}

			return result;
		}